

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O0

void RansEncSymbolInit(RansEncSymbol *s,uint32_t start,uint32_t freq,uint32_t scale_bits)

{
  short sVar1;
  byte bVar2;
  uint32_t shift;
  uint32_t scale_bits_local;
  uint32_t freq_local;
  uint32_t start_local;
  RansEncSymbol *s_local;
  
  if (0x10 < scale_bits) {
    __assert_fail("scale_bits <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                  ,0xb9,"void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)");
  }
  bVar2 = (byte)scale_bits;
  if (start <= (uint)(1 << (bVar2 & 0x1f))) {
    if (freq <= (1 << (bVar2 & 0x1f)) - start) {
      s->x_max = (0x800000U >> (bVar2 & 0x1f)) * 0x100 * freq;
      s->cmpl_freq = (short)(1 << (bVar2 & 0x1f)) - (short)freq;
      if (freq < 2) {
        s->rcp_freq = 0xffffffff;
        s->rcp_shift = 0;
        s->bias = (start + (1 << (bVar2 & 0x1f))) - 1;
      }
      else {
        for (sVar1 = 0; (uint)(1 << ((byte)sVar1 & 0x1f)) < freq; sVar1 = sVar1 + 1) {
        }
        s->rcp_freq = (uint32_t)
                      ((((1L << ((byte)sVar1 + 0x1f & 0x3f)) + (ulong)freq) - 1) / (ulong)freq);
        s->rcp_shift = sVar1 - 1;
        s->bias = start;
      }
      s->rcp_shift = s->rcp_shift + 0x20;
      return;
    }
    __assert_fail("freq <= (1u << scale_bits) - start",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                  ,0xbb,"void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)");
  }
  __assert_fail("start <= (1u << scale_bits)",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                ,0xba,"void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)");
}

Assistant:

static inline void RansEncSymbolInit(RansEncSymbol* s, uint32_t start, uint32_t freq, uint32_t scale_bits)
{
    RansAssert(scale_bits <= 16);
    RansAssert(start <= (1u << scale_bits));
    RansAssert(freq <= (1u << scale_bits) - start);

    // Say M := 1 << scale_bits.
    //
    // The original encoder does:
    //   x_new = (x/freq)*M + start + (x%freq)
    //
    // The fast encoder does (schematically):
    //   q     = mul_hi(x, rcp_freq) >> rcp_shift   (division)
    //   r     = x - q*freq                         (remainder)
    //   x_new = q*M + bias + r                     (new x)
    // plugging in r into x_new yields:
    //   x_new = bias + x + q*(M - freq)
    //        =: bias + x + q*cmpl_freq             (*)
    //
    // and we can just precompute cmpl_freq. Now we just need to
    // set up our parameters such that the original encoder and
    // the fast encoder agree.

    s->x_max = ((RANS_BYTE_L >> scale_bits) << 8) * freq;
    s->cmpl_freq = (uint16_t) ((1 << scale_bits) - freq);
    if (freq < 2) {
        // freq=0 symbols are never valid to encode, so it doesn't matter what
        // we set our values to.
        //
        // freq=1 is tricky, since the reciprocal of 1 is 1; unfortunately,
        // our fixed-point reciprocal approximation can only multiply by values
        // smaller than 1.
        //
        // So we use the "next best thing": rcp_freq=0xffffffff, rcp_shift=0.
        // This gives:
        //   q = mul_hi(x, rcp_freq) >> rcp_shift
        //     = mul_hi(x, (1<<32) - 1)) >> 0
        //     = floor(x - x/(2^32))
        //     = x - 1 if 1 <= x < 2^32
        // and we know that x>0 (x=0 is never in a valid normalization interval).
        //
        // So we now need to choose the other parameters such that
        //   x_new = x*M + start
        // plug it in:
        //     x*M + start                   (desired result)
        //   = bias + x + q*cmpl_freq        (*)
        //   = bias + x + (x - 1)*(M - 1)    (plug in q=x-1, cmpl_freq)
        //   = bias + 1 + (x - 1)*M
        //   = x*M + (bias + 1 - M)
        //
        // so we have start = bias + 1 - M, or equivalently
        //   bias = start + M - 1.
        s->rcp_freq = ~0u;
        s->rcp_shift = 0;
        s->bias = start + (1 << scale_bits) - 1;
    } else {
        // Alverson, "Integer Division using reciprocals"
        // shift=ceil(log2(freq))
        uint32_t shift = 0;
        while (freq > (1u << shift))
            shift++;

        s->rcp_freq = (uint32_t) (((1ull << (shift + 31)) + freq-1) / freq);
        s->rcp_shift = shift - 1;

        // With these values, 'q' is the correct quotient, so we
        // have bias=start.
        s->bias = start;
    }

    s->rcp_shift += 32; // Avoid the extra >>32 in RansEncPutSymbol
}